

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommaInitializer.h
# Opt level: O2

CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> * __thiscall
Eigen::CommaInitializer<Eigen::Matrix<double,3,3,0,3,3>>::operator_
          (CommaInitializer<Eigen::Matrix<double,3,3,0,3,3>> *this,
          DenseBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *other)

{
  long lVar1;
  uint __line;
  long lVar2;
  char *__assertion;
  Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> BStack_48;
  
  lVar2 = *(long *)(this + 0x10);
  if (lVar2 == 3) {
    lVar2 = *(long *)(this + 8);
    lVar1 = *(long *)(this + 0x18);
    *(long *)(this + 8) = lVar2 + lVar1;
    *(undefined8 *)(this + 0x10) = 0;
    *(undefined8 *)(this + 0x18) = 1;
    if (2 < lVar2 + lVar1) {
      __assertion = 
      "m_row+m_currentBlockRows<=m_xpr.rows() && \"Too many rows passed to comma initializer (operator<<)\""
      ;
      __line = 0x5d;
      goto LAB_0012ccf0;
    }
    lVar2 = 0;
  }
  else if (0 < lVar2) {
    __assertion = 
    "(m_col + other.cols() <= m_xpr.cols()) && \"Too many coefficients passed to comma initializer (operator<<)\""
    ;
    __line = 0x60;
    goto LAB_0012ccf0;
  }
  if (*(long *)(this + 0x18) == 1) {
    Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>::Block
              (&BStack_48,*(Matrix<double,_3,_3,_0,_3,_3> **)this,*(Index *)(this + 8),lVar2,1,3);
    internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,1,3,1,1,3>>
              (&BStack_48,(Matrix<double,_1,_3,_1,_1,_3> *)other);
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 3;
    return (CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this;
  }
  __assertion = "m_currentBlockRows==other.rows()";
  __line = 0x61;
LAB_0012ccf0:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CommaInitializer.h"
                ,__line,
                "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::operator,(const DenseBase<OtherDerived> &) [MatrixType = Eigen::Matrix<double, 3, 3>, OtherDerived = Eigen::Matrix<double, 1, 3>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC
  CommaInitializer& operator,(const DenseBase<OtherDerived>& other)
  {
    if (m_col==m_xpr.cols() && (other.cols()!=0 || other.rows()!=m_currentBlockRows))
    {
      m_row+=m_currentBlockRows;
      m_col = 0;
      m_currentBlockRows = other.rows();
      eigen_assert(m_row+m_currentBlockRows<=m_xpr.rows()
        && "Too many rows passed to comma initializer (operator<<)");
    }
    eigen_assert((m_col + other.cols() <= m_xpr.cols())
      && "Too many coefficients passed to comma initializer (operator<<)");
    eigen_assert(m_currentBlockRows==other.rows());
    m_xpr.template block<OtherDerived::RowsAtCompileTime, OtherDerived::ColsAtCompileTime>
                    (m_row, m_col, other.rows(), other.cols()) = other;
    m_col += other.cols();
    return *this;
  }